

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeString::indexOf
          (UnicodeString *this,char16_t *srcChars,int32_t srcLength,int32_t start)

{
  int32_t srcLength_00;
  UChar *srcChars_00;
  int32_t iVar1;
  int32_t iVar2;
  int32_t local_20;
  int32_t local_1c;
  int32_t start_local;
  int32_t srcLength_local;
  char16_t *srcChars_local;
  UnicodeString *this_local;
  
  local_20 = start;
  local_1c = srcLength;
  _start_local = srcChars;
  srcChars_local = (char16_t *)this;
  pinIndex(this,&local_20);
  srcChars_00 = _start_local;
  srcLength_00 = local_1c;
  iVar2 = local_20;
  iVar1 = length(this);
  iVar2 = indexOf(this,srcChars_00,0,srcLength_00,iVar2,iVar1 - local_20);
  return iVar2;
}

Assistant:

inline int32_t
UnicodeString::indexOf(const char16_t *srcChars,
               int32_t srcLength,
               int32_t start) const {
  pinIndex(start);
  return indexOf(srcChars, 0, srcLength, start, length() - start);
}